

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkDfsIter(Abc_Ntk_t *pNtk,int fCollectAll)

{
  ulong uVar1;
  int iVar2;
  undefined4 uVar3;
  long *plVar4;
  long lVar5;
  Abc_Ntk_t *pAVar6;
  int *piVar7;
  Vec_Ptr_t *vNodes;
  void **ppvVar8;
  Vec_Ptr_t *vStack;
  Vec_Ptr_t *pVVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar10;
  Abc_Obj_t *pAVar11;
  long lVar12;
  int iVar13;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar2 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar13 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar13) {
      piVar7 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar7;
      if (piVar7 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar13;
    }
    if (-500 < iVar2) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar13;
  }
  iVar2 = pNtk->nTravIds;
  pNtk->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 1000;
    vNodes->nSize = 0;
    ppvVar8 = (void **)malloc(8000);
    vNodes->pArray = ppvVar8;
    vStack = (Vec_Ptr_t *)malloc(0x10);
    vStack->nCap = 1000;
    vStack->nSize = 0;
    ppvVar8 = (void **)malloc(8000);
    vStack->pArray = ppvVar8;
    pVVar9 = pNtk->vCos;
    uVar10 = extraout_RDX;
    if (0 < pVVar9->nSize) {
      lVar12 = 0;
      do {
        plVar4 = (long *)pVVar9->pArray[lVar12];
        lVar5 = *plVar4;
        uVar3 = *(undefined4 *)(lVar5 + 0xd8);
        iVar2 = (int)plVar4[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar2 + 1,(int)uVar10);
        if (((long)iVar2 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar2 * 4) = uVar3;
        pAVar11 = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
        if (pAVar11->pNtk->ntkType == ABC_NTK_NETLIST) {
          pAVar11 = (Abc_Obj_t *)pAVar11->pNtk->vObjs->pArray[*(pAVar11->vFanins).pArray];
        }
        Abc_NtkDfs_iter(vStack,pAVar11,vNodes);
        lVar12 = lVar12 + 1;
        pVVar9 = pNtk->vCos;
        uVar10 = extraout_RDX_00;
      } while (lVar12 < pVVar9->nSize);
    }
    if ((fCollectAll != 0) && (pVVar9 = pNtk->vObjs, 0 < pVVar9->nSize)) {
      lVar12 = 0;
      do {
        pAVar11 = (Abc_Obj_t *)pVVar9->pArray[lVar12];
        if ((pAVar11 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar11->field_0x14 & 0xf) == 7)) {
          pAVar6 = pAVar11->pNtk;
          iVar2 = pAVar11->Id;
          Vec_IntFillExtra(&pAVar6->vTravIds,iVar2 + 1,(int)uVar10);
          if (((long)iVar2 < 0) || ((pAVar6->vTravIds).nSize <= iVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar10 = extraout_RDX_01;
          if ((pAVar6->vTravIds).pArray[iVar2] != pAVar11->pNtk->nTravIds) {
            Abc_NtkDfs_iter(vStack,pAVar11,vNodes);
            uVar10 = extraout_RDX_02;
          }
        }
        lVar12 = lVar12 + 1;
        pVVar9 = pNtk->vObjs;
      } while (lVar12 < pVVar9->nSize);
    }
    if (vStack->pArray != (void **)0x0) {
      free(vStack->pArray);
      vStack->pArray = (void **)0x0;
    }
    free(vStack);
    return vNodes;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsIter( Abc_Ntk_t * pNtk, int fCollectAll )
{
    Vec_Ptr_t * vNodes, * vStack;
    Abc_Obj_t * pObj;
    int i;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 1000 );
    vStack = Vec_PtrAlloc( 1000 );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Abc_NodeSetTravIdCurrent( pObj );
        Abc_NtkDfs_iter( vStack, Abc_ObjFanin0Ntk(Abc_ObjFanin0(pObj)), vNodes );
    }
    // collect dangling nodes if asked to
    if ( fCollectAll )
    { 
        Abc_NtkForEachNode( pNtk, pObj, i )
            if ( !Abc_NodeIsTravIdCurrent(pObj) )
                Abc_NtkDfs_iter( vStack, pObj, vNodes );
    }
    Vec_PtrFree( vStack );
    return vNodes;
}